

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O2

void exe_save_again_obj(vocoldef *againv,vocoldef *objv,char **bufp)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  undefined4 uVar4;
  objnum oVar5;
  undefined6 uVar6;
  size_t sVar7;
  
  if (objv == (vocoldef *)0x0) {
    againv->vocolobj = 0xffff;
  }
  else {
    uVar4 = *(undefined4 *)&objv->field_0x24;
    againv->vocolflg = objv->vocolflg;
    *(undefined4 *)&againv->field_0x24 = uVar4;
    oVar5 = objv->vocolobj;
    uVar6 = *(undefined6 *)&objv->field_0x2;
    pcVar1 = objv->vocolfst;
    pcVar2 = objv->vocolhlst;
    againv->vocollst = objv->vocollst;
    againv->vocolhlst = pcVar2;
    againv->vocolobj = oVar5;
    *(undefined6 *)&againv->field_0x2 = uVar6;
    againv->vocolfst = pcVar1;
    pcVar1 = objv->vocolfst;
    if ((pcVar1 != (char *)0x0) && (pcVar2 = objv->vocollst, pcVar2 != (char *)0x0)) {
      sVar7 = strlen(pcVar2);
      memcpy(*bufp,pcVar1,(size_t)(pcVar2 + (sVar7 - (long)pcVar1) + 1));
      pcVar3 = *bufp;
      againv->vocolfst = pcVar3;
      againv->vocollst = pcVar3 + ((long)objv->vocollst - (long)objv->vocolfst);
      *bufp = *bufp + (long)(pcVar2 + (sVar7 - (long)pcVar1) + 1);
    }
  }
  return;
}

Assistant:

static void exe_save_again_obj(vocoldef *againv, const vocoldef *objv,
                               char **bufp)
{
    /* if there's an object, save it */
    if (objv != 0)
    {
        /* copy the object information structure */
        memcpy(againv, objv, sizeof(*againv));

        /* copy the original command words to the "again" buffer */
        if (objv->vocolfst != 0 && objv->vocollst != 0)
        {
            size_t copylen;
            
            /* 
             *   Compute the length of the entire list.  The words are
             *   arranged consecutively in the buffer, separated by null
             *   bytes, so we must copy everything from the first word to
             *   the start of the last word, plus the length of the last
             *   word, plus the last word's trailing null byte.  
             */
            copylen = objv->vocollst - objv->vocolfst
                      + strlen(objv->vocollst) + 1;

            /* copy the text */
            memcpy(*bufp, objv->vocolfst, copylen);

            /* 
             *   set the new structure to point into the copy, not the
             *   original 
             */
            againv->vocolfst = *bufp;
            againv->vocollst = *bufp + (objv->vocollst - objv->vocolfst);

            /* skip past the space we've consumed in the buffer */
            *bufp += copylen;
        }
    }
    else
    {
        /* there's nothing to save - just set the object ID to invalid */
        againv->vocolobj = MCMONINV;
    }
}